

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O1

int intCallback(uint user_gpio,uint edge,void *f,void *user,int ex)

{
  int iVar1;
  callback_t *pcVar2;
  
  iVar1 = -0x7d8;
  pcVar2 = gCallBackFirst;
  if (f != (void *)0x0 && (edge < 3 && user_gpio < 0x20)) {
    for (; pcVar2 != (callback_t *)0x0; pcVar2 = pcVar2->next) {
      if (((pcVar2->gpio == user_gpio) && (pcVar2->edge == edge)) && (pcVar2->f == (CBF_t)f)) {
        return -0x7d6;
      }
    }
    pcVar2 = (callback_t *)malloc(0x38);
    if (pcVar2 == (callback_t *)0x0) {
      iVar1 = -0x7d7;
    }
    else {
      if (gCallBackFirst == (callback_t *)0x0) {
        gCallBackFirst = pcVar2;
      }
      iVar1 = intCallback::id + 1;
      pcVar2->id = intCallback::id;
      intCallback::id = iVar1;
      pcVar2->gpio = user_gpio;
      pcVar2->edge = edge;
      pcVar2->f = (CBF_t)f;
      pcVar2->user = user;
      pcVar2->ex = ex;
      pcVar2->next = (callback_t *)0x0;
      pcVar2->prev = gCallBackLast;
      if (gCallBackLast != (callback_t *)0x0) {
        gCallBackLast->next = pcVar2;
      }
      gCallBackLast = pcVar2;
      findNotifyBits();
      iVar1 = pcVar2->id;
    }
  }
  return iVar1;
}

Assistant:

static int intCallback(unsigned user_gpio, unsigned edge, void *f, void *user, int ex)
{
   static int id = 0;
   callback_t *p;

   if ((user_gpio >=0) && (user_gpio < 32) && (edge >=0) && (edge <= 2) && f)
   {
      /* prevent duplicates */

      p = gCallBackFirst;

      while (p)
      {
         if ((p->gpio == user_gpio) && (p->edge == edge) && (p->f == f))
         {
            return pigif_duplicate_callback;
         }
         p = p->next;
      }

      p = malloc(sizeof(callback_t));

      if (p)
      {
         if (!gCallBackFirst) gCallBackFirst = p;

         p->id = id++;
         p->gpio = user_gpio;
         p->edge = edge;
         p->f = f;
         p->user = user;
         p->ex = ex;
         p->next = 0;
         p->prev = gCallBackLast;

         if (p->prev) (p->prev)->next = p;
         gCallBackLast = p;

         findNotifyBits();

         return p->id;
      }

      return pigif_bad_malloc;
   }

   return pigif_bad_callback;
}